

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detect.c
# Opt level: O1

void do_mapping(void)

{
  undefined1 uVar1;
  int x;
  int y;
  
  uVar1 = u._1052_1_;
  u._1052_1_ = u._1052_1_ & 0xfd;
  x = 1;
  do {
    y = 0;
    do {
      show_map_spot(x,y);
      y = y + 1;
    } while (y != 0x15);
    x = x + 1;
  } while (x != 0x50);
  exercise(2,'\x01');
  u._1052_1_ = u._1052_1_ & 0xfd | uVar1 & 2;
  if (((byte)(level->flags).field_0x9 >> 6 & (uVar1 & 2) == 0) != 0) {
    return;
  }
  flush_screen();
  (*windowprocs.win_pause)(P_MAP);
  doredraw();
  return;
}

Assistant:

void do_mapping(void)
{
    int zx, zy;
    int uw = u.uinwater;

    u.uinwater = 0;
    for (zx = 1; zx < COLNO; zx++)
	for (zy = 0; zy < ROWNO; zy++)
	    show_map_spot(zx, zy);
    exercise(A_WIS, TRUE);
    u.uinwater = uw;
    if (!level->flags.hero_memory || Underwater) {
	flush_screen();			/* flush temp screen */
	win_pause_output(P_MAP);	/* wait */
	doredraw();
    }
}